

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall LinearNE<0,_1,_0>::wakeup(LinearNE<0,_1,_0> *this,int i,int param_3)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  Tint *unaff_retaddr;
  int64_t in_stack_00000008;
  Tint64_t *in_stack_00000010;
  Propagator *in_stack_ffffffffffffffe0;
  long lVar2;
  
  if (in_ESI < *(int *)(in_RDI + 0x18)) {
    lVar2 = in_RDI;
    Tint::operator_cast_to_int((Tint *)(in_RDI + 0x48));
    Tint::operator=(unaff_retaddr,(int)((ulong)lVar2 >> 0x20));
    if (in_ESI < *(int *)(in_RDI + 0x14)) {
      in_stack_ffffffffffffffe0 =
           (Propagator *)Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
      IntView<0>::getVal((IntView<0> *)in_stack_ffffffffffffffe0);
      Tint64_t::operator=(in_stack_00000010,in_stack_00000008);
    }
    else {
      Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
      IntView<1>::getVal((IntView<1> *)in_stack_ffffffffffffffe0);
      Tint64_t::operator=(in_stack_00000010,in_stack_00000008);
    }
  }
  iVar1 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x48));
  if (iVar1 < 2) {
    Propagator::pushInQueue(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < sz) {
			num_unfixed = num_unfixed - 1;
			if (i < sp) {
				sum_fixed = sum_fixed + x[i].getVal();
			} else {
				sum_fixed = sum_fixed + y[i].getVal();
			}
		}
		if (num_unfixed > 1) {
			return;
		}
		if ((R == 0) || r.isTrue() || (!r.isFixed() && num_unfixed == 0)) {
			pushInQueue();
		}
	}